

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

deUint32 glu::getGLCubeFace(CubeFace face)

{
  InternalError *this;
  allocator<char> local_31;
  string local_30;
  CubeFace local_10;
  deUint32 local_c;
  CubeFace face_local;
  
  switch(face) {
  case CUBEFACE_NEGATIVE_X:
    local_c = 0x8516;
    break;
  case CUBEFACE_POSITIVE_X:
    local_c = 0x8515;
    break;
  case CUBEFACE_NEGATIVE_Y:
    local_c = 0x8518;
    break;
  case CUBEFACE_POSITIVE_Y:
    local_c = 0x8517;
    break;
  case CUBEFACE_NEGATIVE_Z:
    local_c = 0x851a;
    break;
  case CUBEFACE_POSITIVE_Z:
    local_c = 0x8519;
    break;
  default:
    local_10 = face;
    this = (InternalError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Can\'t map cube face",&local_31);
    tcu::InternalError::InternalError(this,&local_30);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  return local_c;
}

Assistant:

deUint32 getGLCubeFace (tcu::CubeFace face)
{
	DE_ASSERT(face != tcu::CUBEFACE_LAST);
	switch (face)
	{
		case tcu::CUBEFACE_NEGATIVE_X:	return GL_TEXTURE_CUBE_MAP_NEGATIVE_X;
		case tcu::CUBEFACE_POSITIVE_X:	return GL_TEXTURE_CUBE_MAP_POSITIVE_X;
		case tcu::CUBEFACE_NEGATIVE_Y:	return GL_TEXTURE_CUBE_MAP_NEGATIVE_Y;
		case tcu::CUBEFACE_POSITIVE_Y:	return GL_TEXTURE_CUBE_MAP_POSITIVE_Y;
		case tcu::CUBEFACE_NEGATIVE_Z:	return GL_TEXTURE_CUBE_MAP_NEGATIVE_Z;
		case tcu::CUBEFACE_POSITIVE_Z:	return GL_TEXTURE_CUBE_MAP_POSITIVE_Z;
		default:
			throw tcu::InternalError("Can't map cube face");
	}
}